

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

int tolower(int __c)

{
  long lVar1;
  long lVar2;
  int in_EAX;
  undefined4 in_register_0000003c;
  long lVar3;
  
  lVar1 = *(long *)CONCAT44(in_register_0000003c,__c);
  lVar2 = ((long *)CONCAT44(in_register_0000003c,__c))[1];
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    in_EAX = tolower((uint)*(byte *)(lVar1 + lVar3));
    *(char *)(lVar1 + lVar3) = (char)in_EAX;
  }
  return in_EAX;
}

Assistant:

ProcessedToken(double v) : type(ProcessedTokenType::CONST), value(v){}